

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O1

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp>::close
          (basic_socket_acceptor<asio::ip::tcp> *this,int __fd)

{
  int iVar1;
  error_code ec;
  
  std::_V2::system_category();
  iVar1 = detail::reactive_socket_service_base::close
                    (&((this->
                       super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                       ).service_)->super_reactive_socket_service_base,(int)this + 8);
  return iVar1;
}

Assistant:

void close()
  {
    asio::error_code ec;
    this->get_service().close(this->get_implementation(), ec);
    asio::detail::throw_error(ec, "close");
  }